

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

int __thiscall lattice::graph::init(graph *this,EVP_PKEY_CTX *ctx)

{
  pointer pbVar1;
  invalid_argument *this_00;
  supercell *in_RCX;
  long *plVar2;
  bool bVar3;
  size_t *in_RDX;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  long lVar7;
  size_t s;
  offset_t cell_offset;
  coordinate_t pos;
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> local_78;
  long *local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  sVar6 = *in_RDX;
  if ((sVar6 == in_RCX->dim_) &&
     (sVar6 == *(long *)(CONCAT71(in_register_00000081,in_R8B) + 8) -
               *(long *)CONCAT71(in_register_00000081,in_R8B) >> 2)) {
    this->dim_ = sVar6;
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::clear
              (&this->sites_);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(&this->coordinates_);
    pbVar1 = (this->bonds_).
             super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->bonds_).
        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar1) {
      (this->bonds_).
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar1;
    }
    uVar4 = 0;
    while( true ) {
      uVar5 = in_RCX->num_cells_;
      if (uVar5 <= uVar4) break;
      supercell::offset((supercell *)&cell_offset,(size_t)in_RCX);
      lVar7 = 0;
      for (uVar5 = 0; uVar5 < (ulong)((long)(in_RDX[2] - in_RDX[1]) / 0x18); uVar5 = uVar5 + 1) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)ctx);
        local_58 = (long *)(in_RDX[1] + lVar7);
        local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows = (Index)&cell_offset;
        local_78.first = (unsigned_long)&local_48;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,double>,Eigen::Matrix<long,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pos,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                    *)&local_78);
        free(local_48.m_data);
        add_site(this,&pos,*(int *)(in_RDX[1] + 0x10 + lVar7));
        free(pos.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        lVar7 = lVar7 + 0x18;
      }
      free(cell_offset.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      uVar4 = uVar4 + 1;
    }
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      uVar5 = 0;
      while( true ) {
        if ((ulong)((long)(in_RDX[5] - in_RDX[4]) / 0x28) <= uVar5) break;
        lVar7 = uVar5 * 0x28;
        plVar2 = (long *)(in_RDX[4] + lVar7);
        s = ((long)(in_RDX[2] - in_RDX[1]) / 0x18) * uVar4 + *plVar2;
        supercell::add_offset(&local_78,in_RCX,uVar4,(offset_t *)(plVar2 + 2));
        plVar2 = local_78.second.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        bVar3 = true;
        for (sVar6 = 0; this->dim_ != sVar6; sVar6 = sVar6 + 1) {
          if (*(int *)(*(long *)CONCAT71(in_register_00000081,in_R8B) + sVar6 * 4) == 0) {
            bVar3 = (bool)(bVar3 & (double)local_78.second.
                                           super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data[sVar6] == 0.0);
          }
        }
        if (bVar3) {
          sVar6 = ((long)(in_RDX[2] - in_RDX[1]) / 0x18) * local_78.first +
                  *(long *)(in_RDX[4] + 8 + lVar7);
          if (s != sVar6) {
            add_bond(this,s,sVar6,*(int *)(in_RDX[4] + lVar7 + 0x20));
          }
        }
        free(plVar2);
        uVar5 = uVar5 + 1;
      }
      uVar5 = in_RCX->num_cells_;
    }
    return (int)uVar5;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"dimension mismatch");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

graph(const basis& bs, const unitcell& cell, const extent_t& extent,
        boundary_t boundary = boundary_t::periodic) {
    init(bs, cell, supercell(extent), std::vector<boundary_t>(cell.dimension(), boundary));
  }